

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_suite.hpp
# Opt level: O1

void __thiscall
iutest::TypedTestSuite<unsigned_short>::~TypedTestSuite(TypedTestSuite<unsigned_short> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->m_type_param)._M_dataplus._M_p;
  paVar1 = &(this->m_type_param).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  TestSuite::~TestSuite(&this->super_TestSuite);
  operator_delete(this,0xd0);
  return;
}

Assistant:

class TypedTestSuite IUTEST_CXX_FINAL : public TestSuite
{
public:
    typedef T   TypeParam;  //!< 型

protected:
    /**
     * @brief   コンストラクタ
     * @param [in]  testsuite_name  = TestSuite 名
     * @param [in]  id              = TestSuite ID
     * @param [in]  setup           = テスト事前実行関数
     * @param [in]  teardown        = テスト事後実行関数
    */
    TypedTestSuite(const ::std::string& testsuite_name, TestTypeId id, SetUpMethod setup, TearDownMethod teardown)
        : TestSuite(testsuite_name, id, setup, teardown)
        , m_type_param(detail::GetTypeNameProxy<TypeParam>::GetTypeName())
    {
    }

public:
    /** type param 文字列の取得 */
    virtual const char* type_param() const IUTEST_CXX_OVERRIDE
    {
        return m_type_param.empty() ? NULL : m_type_param.c_str();
    }